

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  undefined8 *puVar2;
  _Atomic_word *p_Var3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>
  *__tmp;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    puVar2 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                         + 0x28))();
    p_Var3 = (_Atomic_word *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                         + 0x28))();
    puVar4 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_superblock_size>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_superblock_size>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_superblock_size>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_false>
                         + 0x28))();
    puVar5 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>
                                   ._M_head_impl.impl_ + 0x28))();
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_01037bf0;
    *(undefined4 *)&p_Var6[1]._vptr__Sp_counted_base = *puVar5;
    *(undefined4 *)((long)&p_Var6[1]._vptr__Sp_counted_base + 4) = *puVar4;
    p_Var6[1]._M_use_count = *p_Var3;
    p_Var6[2]._vptr__Sp_counted_base = (_func_int **)*puVar2;
    (this->current_value_).
    super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var6 + 1);
    this_00 = (this->current_value_).
              super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->current_value_).
    super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var6;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }